

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLock.cxx
# Opt level: O3

void __thiscall cmFileLock::~cmFileLock(cmFileLock *this)

{
  pointer pcVar1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmFileLockResult result;
  cmFileLockResult local_10;
  
  if ((this->Filename)._M_string_length != 0) {
    local_10 = Release(this);
    bVar2 = cmFileLockResult::IsOk(&local_10);
    if (!bVar2) {
      __assert_fail("result.IsOk()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFileLock.cxx"
                    ,0x18,"cmFileLock::~cmFileLock()");
    }
  }
  pcVar1 = (this->Filename)._M_dataplus._M_p;
  paVar3 = &(this->Filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmFileLock::~cmFileLock()
{
  if (!this->Filename.empty()) {
    const cmFileLockResult result = this->Release();
    static_cast<void>(result);
    assert(result.IsOk());
  }
}